

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

void __thiscall Qentem::Value<wchar_t>::Value(Value<wchar_t> *this,bool bl)

{
  bool bl_local;
  Value<wchar_t> *this_local;
  
  memset(this,0,0x10);
  Array<Qentem::Value<wchar_t>_>::Array((Array<Qentem::Value<wchar_t>_> *)this);
  this->type_ = Undefined;
  if (bl) {
    setTypeToTrue(this);
  }
  else {
    setTypeToFalse(this);
  }
  return;
}

Assistant:

explicit Value(bool bl) noexcept {
        if (bl) {
            setTypeToTrue();
        } else {
            setTypeToFalse();
        }
    }